

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong *puVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  size_t n;
  size_t sVar5;
  size_t sVar6;
  
  for (sVar5 = 0; (sVar6 = buflen, buflen != sVar5 && (sVar6 = sVar5, buf[sVar5] == '\0'));
      sVar5 = sVar5 + 1) {
  }
  iVar2 = mbedtls_mpi_grow(X,((buflen - sVar6 >> 3) + 1) - (ulong)((buflen - sVar6 & 7) == 0));
  if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_lset(X,0), iVar2 == 0)) {
    iVar2 = 0;
    bVar3 = 0;
    uVar4 = 0;
    for (; sVar6 < buflen; buflen = buflen - 1) {
      puVar1 = (ulong *)((long)X->p + (uVar4 & 0xfffffffffffffff8));
      *puVar1 = *puVar1 | (ulong)buf[buflen - 1] << (bVar3 & 0x38);
      uVar4 = uVar4 + 1;
      bVar3 = bVar3 + 8;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t i, j, n;

    for( n = 0; n < buflen; n++ )
        if( buf[n] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, CHARS_TO_LIMBS( buflen - n ) ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = buflen, j = 0; i > n; i--, j++ )
        X->p[j / ciL] |= ((mbedtls_mpi_uint) buf[i - 1]) << ((j % ciL) << 3);

cleanup:

    return( ret );
}